

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O2

void GPU_MatrixRotate(float *result,float degrees,float x,float y,float z)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_48;
  float local_44;
  float local_40;
  undefined4 local_3c;
  float local_38;
  float local_34;
  float local_30;
  undefined4 local_2c;
  float local_28;
  float local_24;
  float local_20;
  undefined8 local_1c;
  undefined8 uStack_14;
  undefined4 local_c;
  
  if (result != (float *)0x0) {
    fVar3 = 1.0 / SQRT(z * z + x * x + y * y);
    fVar7 = x * fVar3;
    fVar5 = y * fVar3;
    fVar3 = fVar3 * z;
    fVar1 = cosf(degrees * 0.017453292);
    fVar2 = sinf(degrees * 0.017453292);
    fVar6 = 1.0 - fVar1;
    fVar4 = fVar3 * fVar6;
    local_38 = fVar7 * fVar5 * fVar6;
    local_48 = fVar7 * fVar7 * fVar6 + fVar1;
    local_44 = local_38 + fVar2 * fVar3;
    local_40 = fVar7 * fVar4 - fVar5 * fVar2;
    local_3c = 0;
    local_38 = local_38 - fVar2 * fVar3;
    local_34 = fVar5 * fVar6 * fVar5 + fVar1;
    local_30 = fVar7 * fVar2 + fVar5 * fVar4;
    local_2c = 0;
    local_28 = fVar5 * fVar2 + fVar7 * fVar4;
    local_24 = fVar5 * fVar4 - fVar7 * fVar2;
    local_20 = fVar4 * fVar3 + fVar1;
    local_1c = 0;
    uStack_14 = 0;
    local_c = 0x3f800000;
    GPU_MultiplyAndAssign(result,&local_48);
  }
  return;
}

Assistant:

void GPU_MatrixRotate(float* result, float degrees, float x, float y, float z)
{
	float p, radians, c, s, c_, zc_, yc_, xzc_, xyc_, yzc_, xs, ys, zs;

    if(result == NULL)
		return;

    p = 1/sqrtf(x*x + y*y + z*z);
    x *= p; y *= p; z *= p;
    radians = degrees * RAD_PER_DEG;
    c = cosf(radians);
    s = sinf(radians);
    c_ = 1 - c;
    zc_ = z*c_;
    yc_ = y*c_;
    xzc_ = x*zc_;
    xyc_ = x*y*c_;
    yzc_ = y*zc_;
    xs = x*s;
    ys = y*s;
    zs = z*s;

	{
#ifdef ROW_MAJOR
		float A[16];
		FILL_MATRIX_4x4(A,
				x*x*c_ + c,  xyc_ - zs,   xzc_ + ys, 0,
				xyc_ + zs,   y*yc_ + c,   yzc_ - xs, 0,
				xzc_ - ys,   yzc_ + xs,   z*zc_ + c, 0,
				0,           0,           0,         1
			);
#else
		float A[16];
		FILL_MATRIX_4x4(A,
				x*x*c_ + c, xyc_ + zs, xzc_ - ys, 0,
				xyc_ - zs, y*yc_ + c, yzc_ + xs, 0,
				xzc_ + ys, yzc_ - xs, z*zc_ + c, 0,
				0, 0, 0, 1
			);
#endif

		GPU_MultiplyAndAssign(result, A);
	}
}